

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetFactory.cpp
# Opt level: O0

StyleSheetContainer * Rml::StyleSheetFactory::GetStyleSheetContainer(String *sheet_name)

{
  bool bVar1;
  pointer pSVar2;
  pointer ppVar3;
  type this;
  StyleSheetContainer *result;
  undefined1 local_40 [8];
  UniquePtr<const_StyleSheetContainer> sheet;
  undefined1 local_28 [8];
  iterator it;
  String *sheet_name_local;
  
  it.mInfo = (uint8_t *)sheet_name;
  pSVar2 = ::std::unique_ptr<Rml::StyleSheetFactory,_std::default_delete<Rml::StyleSheetFactory>_>::
           operator->((unique_ptr<Rml::StyleSheetFactory,_std::default_delete<Rml::StyleSheetFactory>_>
                       *)&instance);
  _local_28 = robin_hood::detail::
              Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&pSVar2->stylesheets,(key_type *)it.mInfo);
  pSVar2 = ::std::unique_ptr<Rml::StyleSheetFactory,_std::default_delete<Rml::StyleSheetFactory>_>::
           operator->((unique_ptr<Rml::StyleSheetFactory,_std::default_delete<Rml::StyleSheetFactory>_>
                       *)&instance);
  _sheet = robin_hood::detail::
           Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pSVar2->stylesheets);
  bVar1 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::StyleSheetContainer_const,std::default_delete<Rml::StyleSheetContainer_const>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::Iter<false>::operator!=((Iter<false> *)local_28,(Iter<false> *)&sheet);
  if (bVar1) {
    ppVar3 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Iter<false>::operator->((Iter<false> *)local_28);
    sheet_name_local =
         (String *)
         ::std::
         unique_ptr<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>
         ::get(&ppVar3->second);
  }
  else {
    pSVar2 = ::std::unique_ptr<Rml::StyleSheetFactory,_std::default_delete<Rml::StyleSheetFactory>_>
             ::operator->((unique_ptr<Rml::StyleSheetFactory,_std::default_delete<Rml::StyleSheetFactory>_>
                           *)&instance);
    LoadStyleSheetContainer((StyleSheetFactory *)local_40,(String *)pSVar2);
    bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_40);
    if (bVar1) {
      sheet_name_local =
           (String *)
           ::std::
           unique_ptr<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>
           ::get((unique_ptr<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>
                  *)local_40);
      pSVar2 = ::std::
               unique_ptr<Rml::StyleSheetFactory,_std::default_delete<Rml::StyleSheetFactory>_>::
               operator->((unique_ptr<Rml::StyleSheetFactory,_std::default_delete<Rml::StyleSheetFactory>_>
                           *)&instance);
      this = robin_hood::detail::
             Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::StyleSheetContainer_const,std::default_delete<Rml::StyleSheetContainer_const>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
             ::
             operator[]<std::unique_ptr<Rml::StyleSheetContainer_const,std::default_delete<Rml::StyleSheetContainer_const>>>
                       ((Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::StyleSheetContainer_const,std::default_delete<Rml::StyleSheetContainer_const>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                         *)pSVar2,(key_type *)it.mInfo);
      ::std::
      unique_ptr<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>
      ::operator=(this,(unique_ptr<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>
                        *)local_40);
    }
    else {
      sheet_name_local = (String *)0x0;
    }
    ::std::
    unique_ptr<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>
    ::~unique_ptr((unique_ptr<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>
                   *)local_40);
  }
  return (StyleSheetContainer *)sheet_name_local;
}

Assistant:

const StyleSheetContainer* StyleSheetFactory::GetStyleSheetContainer(const String& sheet_name)
{
	// Look up the sheet definition in the cache
	auto it = instance->stylesheets.find(sheet_name);
	if (it != instance->stylesheets.end())
		return it->second.get();

	// Don't currently have the sheet, attempt to load it
	UniquePtr<const StyleSheetContainer> sheet = instance->LoadStyleSheetContainer(sheet_name);
	if (!sheet)
		return nullptr;

	const StyleSheetContainer* result = sheet.get();

	// Add it to the cache.
	instance->stylesheets[sheet_name] = std::move(sheet);

	return result;
}